

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O3

PockleStatus pockle_add_small_prime(Pockle *pockle,mp_int *p)

{
  uint uVar1;
  uintmax_t uVar2;
  long lVar3;
  PockleStatus PVar4;
  
  uVar1 = mp_hs_integer(p,0x100000000);
  PVar4 = POCKLE_SMALL_PRIME_NOT_SMALL;
  if (uVar1 == 0) {
    uVar2 = mp_get_integer(p);
    PVar4 = POCKLE_PRIME_SMALLER_THAN_2;
    if (1 < (uint)uVar2) {
      init_smallprimes();
      lVar3 = 0;
      do {
        if ((uint)uVar2 == (uint)smallprimes_array[lVar3]) break;
        if ((int)((uVar2 & 0xffffffff) % (ulong)(uint)smallprimes_array[lVar3]) == 0) {
          return POCKLE_SMALL_PRIME_NOT_PRIME;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x198e);
      PVar4 = POCKLE_OK;
      pockle_insert(pockle,p,(mp_int **)0x0,0,(mp_int *)0x0);
    }
  }
  return PVar4;
}

Assistant:

PockleStatus pockle_add_small_prime(Pockle *pockle, mp_int *p)
{
    if (mp_hs_integer(p, (1ULL << 32)))
        return POCKLE_SMALL_PRIME_NOT_SMALL;

    uint32_t val = mp_get_integer(p);

    if (val < 2)
        return POCKLE_PRIME_SMALLER_THAN_2;

    init_smallprimes();
    for (size_t i = 0; i < NSMALLPRIMES; i++) {
        if (val == smallprimes[i])
            break; /* success */
        if (val % smallprimes[i] == 0)
            return POCKLE_SMALL_PRIME_NOT_PRIME;
    }

    return pockle_insert(pockle, p, NULL, 0, NULL);
}